

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable_list.h
# Opt level: O3

void __thiscall hittable_list::add(hittable_list *this,shared_ptr<hittable> *object)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (&this->objects,object);
  (*((object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_hittable[3])
            (&local_48);
  dVar1 = (this->bbox).x.min;
  dVar2 = (this->bbox).x.max;
  dVar3 = (this->bbox).y.min;
  dVar4 = (this->bbox).y.max;
  dVar5 = (this->bbox).z.min;
  dVar6 = (this->bbox).z.max;
  uVar7 = -(ulong)(dVar1 <= local_48);
  uVar8 = -(ulong)(dStack_40 <= dVar2);
  (this->bbox).x.min = (double)(~uVar7 & (ulong)local_48 | (ulong)dVar1 & uVar7);
  (this->bbox).x.max = (double)(~uVar8 & (ulong)dStack_40 | (ulong)dVar2 & uVar8);
  uVar7 = -(ulong)(dVar3 <= local_38);
  uVar8 = -(ulong)(dStack_30 <= dVar4);
  (this->bbox).y.min = (double)(~uVar7 & (ulong)local_38 | (ulong)dVar3 & uVar7);
  (this->bbox).y.max = (double)(~uVar8 & (ulong)dStack_30 | (ulong)dVar4 & uVar8);
  uVar7 = -(ulong)(dVar5 <= local_28);
  uVar8 = -(ulong)(dStack_20 <= dVar6);
  (this->bbox).z.min = (double)(~uVar7 & (ulong)local_28 | (ulong)dVar5 & uVar7);
  (this->bbox).z.max = (double)(~uVar8 & (ulong)dStack_20 | (ulong)dVar6 & uVar8);
  return;
}

Assistant:

void add(shared_ptr<hittable> object) {
        objects.push_back(object);
        bbox = aabb(bbox, object->bounding_box());
    }